

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O1

RC __thiscall PF_BufferMgr::AllocateBlock(PF_BufferMgr *this,char **buffer)

{
  PF_BufPageDesc *pPVar1;
  RC RVar2;
  int pageNum;
  undefined8 in_RAX;
  long lVar3;
  int slot;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  RVar2 = InternalAlloc(this,&local_34);
  if (RVar2 == 0) {
    lVar3 = (long)local_34;
    pageNum = atoi(this->bufTable[lVar3].pData);
    RVar2 = PF_HashTable::Insert(&this->hashTable,-1,pageNum,local_34);
    if (RVar2 == 0) {
      pPVar1 = this->bufTable;
      pPVar1[lVar3].fd = -1;
      pPVar1[lVar3].pageNum = pageNum;
      pPVar1[lVar3].bDirty = 0;
      pPVar1[lVar3].pinCount = 1;
      *buffer = pPVar1[lVar3].pData;
      RVar2 = 0;
    }
    else {
      Unlink(this,local_34);
      this->bufTable[lVar3].next = this->free;
      this->free = local_34;
      RVar2 = 1;
    }
  }
  return RVar2;
}

Assistant:

RC PF_BufferMgr::AllocateBlock(char *&buffer)
{
   RC rc = OK_RC;

   // Get an empty slot from the buffer pool
   int slot;
   if ((rc = InternalAlloc(slot)) != OK_RC)
      return rc;

   // Create artificial page number (just needs to be unique for hash table)
   PageNum pageNum = PageNum(atoi(bufTable[slot].pData));

   // Insert the page into the hash table, and initialize the page description entry
   if ((rc = hashTable.Insert(MEMORY_FD, pageNum, slot) != OK_RC) ||
         (rc = InitPageDesc(MEMORY_FD, pageNum, slot)) != OK_RC) {
      // Put the slot back on the free list before returning the error
      Unlink(slot);
      InsertFree(slot);
      return rc;
   }

   // Return pointer to buffer
   buffer = bufTable[slot].pData;

   // Return success code
   return OK_RC;
}